

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

int evutil_read_file_(char *filename,char **content_out,size_t *len_out,int is_binary)

{
  int __fd;
  int iVar1;
  char *ptr;
  ssize_t sVar2;
  uint uVar3;
  size_t sVar4;
  stat st;
  stat local_c0;
  
  if (content_out == (char **)0x0) {
    evutil_read_file__cold_2();
  }
  else if (len_out != (size_t *)0x0) {
    *content_out = (char *)0x0;
    *len_out = 0;
    __fd = evutil_open_closeonexec_(filename,0,0);
    if (__fd < 0) {
      return -1;
    }
    iVar1 = fstat(__fd,&local_c0);
    if (((ulong)local_c0.st_size < 0x7fffffffffffffff && iVar1 == 0) &&
       (ptr = (char *)event_mm_malloc_(local_c0.st_size + 1), ptr != (char *)0x0)) {
      sVar4 = 0;
      do {
        sVar2 = read(__fd,ptr + sVar4,local_c0.st_size - sVar4);
        uVar3 = (uint)sVar2;
        if ((int)uVar3 < 1) break;
        sVar4 = sVar4 + (uVar3 & 0x7fffffff);
      } while (sVar4 < (ulong)local_c0.st_size);
      close(__fd);
      if (-1 < (int)uVar3) {
        ptr[sVar4] = '\0';
        *len_out = sVar4;
        *content_out = ptr;
        return 0;
      }
      event_mm_free_(ptr);
    }
    else {
      close(__fd);
    }
    return -2;
  }
  evutil_read_file__cold_1();
}

Assistant:

int
evutil_read_file_(const char *filename, char **content_out, size_t *len_out,
    int is_binary)
{
	int fd, r;
	struct stat st;
	char *mem;
	size_t read_so_far=0;
	int mode = O_RDONLY;

	EVUTIL_ASSERT(content_out);
	EVUTIL_ASSERT(len_out);
	*content_out = NULL;
	*len_out = 0;

#ifdef O_BINARY
	if (is_binary)
		mode |= O_BINARY;
#endif

	fd = evutil_open_closeonexec_(filename, mode, 0);
	if (fd < 0)
		return -1;
	if (fstat(fd, &st) || st.st_size < 0 ||
	    st.st_size > EV_SSIZE_MAX-1 ) {
		close(fd);
		return -2;
	}
	mem = mm_malloc((size_t)st.st_size + 1);
	if (!mem) {
		close(fd);
		return -2;
	}
	read_so_far = 0;
#ifdef _WIN32
#define N_TO_READ(x) ((x) > INT_MAX) ? INT_MAX : ((int)(x))
#else
#define N_TO_READ(x) (x)
#endif
	while ((r = read(fd, mem+read_so_far, N_TO_READ(st.st_size - read_so_far))) > 0) {
		read_so_far += r;
		if (read_so_far >= (size_t)st.st_size)
			break;
		EVUTIL_ASSERT(read_so_far < (size_t)st.st_size);
	}
	close(fd);
	if (r < 0) {
		mm_free(mem);
		return -2;
	}
	mem[read_so_far] = 0;

	*len_out = read_so_far;
	*content_out = mem;
	return 0;
}